

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellReissner4::UpdateNodalAndAveragePosAndOrientation
          (ChElementShellReissner4 *this)

{
  long *plVar1;
  long lVar2;
  ChMatrix33<double> *pCVar3;
  long lVar4;
  ChVector<double> *pCVar5;
  ChMatrix33<double> *pCVar6;
  undefined1 auVar7 [64];
  double dVar8;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  ChMatrix33<double> R_tilde_n [4];
  ChMatrix33<double> Tn [4];
  assign_op<double,_double> local_369;
  SrcEvaluatorType local_368;
  double local_338;
  plainobjectbase_evaluator_data<double,_3> local_330;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_328;
  undefined1 local_308 [16];
  double dStack_2f8;
  double dStack_2f0;
  double dStack_2e8;
  double dStack_2e0;
  double dStack_2d8;
  double dStack_2d0;
  double local_2c8;
  undefined1 local_2b8 [64];
  ChMatrix33<double> local_278 [4];
  ChMatrix33<double> local_158 [4];
  
  pCVar5 = this->xa;
  pCVar3 = this->iTa;
  auVar7 = ZEXT864(0) << 0x40;
  dVar8 = 0.0;
  pCVar6 = local_158;
  lVar4 = 0;
  local_2c8 = 0.0;
  do {
    lVar2 = *(long *)((long)&(((this->m_nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar4);
    if (pCVar5 != (ChVector<double> *)(lVar2 + 0x20)) {
      pCVar5->m_data[0] = *(double *)(lVar2 + 0x20);
      pCVar5->m_data[1] = *(double *)(lVar2 + 0x28);
      pCVar5->m_data[2] = *(double *)(lVar2 + 0x30);
    }
    local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)(lVar2 + 0x58);
    local_338 = dVar8;
    local_2b8 = auVar7;
    local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)pCVar3;
    ChMatrix33<double>::operator=
              (pCVar6,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                       *)local_278);
    local_328.m_dst = (DstEvaluatorType *)&local_330;
    local_328.m_src = &local_368;
    local_328.m_functor = &local_369;
    local_368.
    super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs = (type)(*(long *)((long)&(((this->m_nodes).
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar4) + 0x58);
    local_368.
    super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_innerDim = 3;
    local_368.
    super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhs = &pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>;
    local_368.
    super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
    data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
           (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
           local_368.
           super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
           .m_lhs;
    local_368.
    super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
    data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
           (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)pCVar3;
    local_330.data = (double *)local_278;
    local_328.m_dstExpr = (DstXprType *)local_278;
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
    ::run(&local_328);
    pCVar6 = pCVar6 + 1;
    pCVar3 = pCVar3 + 1;
    pCVar5 = pCVar5 + 1;
    lVar4 = lVar4 + 0x10;
    auVar7._8_8_ = local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar7._0_8_ = local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar7._16_8_ =
         local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar7._24_8_ =
         local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar7._32_8_ =
         local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar7._40_8_ =
         local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar7._48_8_ =
         local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar7._56_8_ =
         local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar7 = vpermpd_avx512f(_DAT_009b7200,auVar7);
    dVar8 = local_338 +
            local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar7 = vaddpd_avx512f(auVar7,local_2b8);
    _local_308 = auVar7;
  } while (lVar4 != 0x40);
  local_308._0_8_ = auVar7._0_8_;
  local_308._8_8_ = auVar7._8_8_;
  local_308._8_8_ = (double)local_308._8_8_ * 0.25;
  local_308._0_8_ = (double)local_308._0_8_ * 0.25;
  dStack_2f8 = auVar7._16_8_;
  dStack_2f0 = auVar7._24_8_;
  dStack_2f8 = dStack_2f8 * 0.25;
  dStack_2f0 = dStack_2f0 * 0.25;
  dStack_2e8 = auVar7._32_8_;
  dStack_2e0 = auVar7._40_8_;
  dStack_2e8 = dStack_2e8 * 0.25;
  dStack_2e0 = dStack_2e0 * 0.25;
  local_2c8 = dVar8 * 0.25;
  dStack_2d8 = auVar7._48_8_;
  dStack_2d0 = auVar7._56_8_;
  dStack_2d8 = dStack_2d8 * 0.25;
  dStack_2d0 = dStack_2d0 * 0.25;
  rotutils::VecRot((ChVector<double> *)&local_368,(ChMatrix33<double> *)local_308);
  pCVar3 = local_278;
  rotutils::Rot(pCVar3,(ChVector<double> *)&local_368);
  pCVar6 = local_158;
  lVar4 = 0;
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  do {
    local_368.
    super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs = &(this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>;
    local_368.
    super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhs = &pCVar6->super_Matrix<double,_3,_3,_1,_3,_3>;
    ChMatrix33<double>::operator=
              (pCVar3,(MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                       *)&local_368);
    rotutils::VecRot((ChVector<double> *)&local_368,pCVar3);
    pCVar3 = pCVar3 + 1;
    pCVar6 = pCVar6 + 1;
    plVar1 = (long *)((long)this->phi_tilde_n[0].m_data + lVar4);
    *plVar1 = (long)local_368.
                    super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs;
    plVar1[1] = (long)local_368.
                      super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                      .m_rhs;
    ((plainobjectbase_evaluator_data<double,_3> *)((long)this->phi_tilde_n[0].m_data + lVar4 + 0x10)
    )->data = (double *)
              local_368.
              super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhsImpl.
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x60);
  return;
}

Assistant:

void ChElementShellReissner4::UpdateNodalAndAveragePosAndOrientation() {
    ChMatrix33<> Tn[NUMNODES];
    ChMatrix33<> T_avg;
    T_avg.setZero();
    for (int i = 0; i < NUMNODES; i++) {
        xa[i] = this->m_nodes[i]->GetPos();
        Tn[i] = this->m_nodes[i]->GetA() * iTa[i];
        T_avg += this->m_nodes[i]->GetA() * iTa[i];  //***TODO*** use predicted rot?
    }
    T_avg *= 0.25;
    T_overline = rotutils::Rot(rotutils::VecRot(T_avg));
    /*
        // ***ALEX*** test an alternative for T_overline:
        // average four rotations with quaternion averaging:
        ChQuaternion<> qTa = Tn[0].Get_A_quaternion();
        ChQuaternion<> qTb = Tn[1].Get_A_quaternion();
        if ( (qTa ^ qTb) < 0)
            qTb *= -1;
        ChQuaternion<> qTc = Tn[2].Get_A_quaternion();
        if ( (qTa ^ qTc) < 0)
            qTc *= -1;
        ChQuaternion<> qTd = Tn[3].Get_A_quaternion();
        if ( (qTa ^ qTd) < 0)
            qTd *= -1;
        ChQuaternion<> Tavg =(qTa + qTb + qTc + qTd ).GetNormalized();
        T_overline.Set_A_quaternion(Tavg);
    */

    ChMatrix33<> R_tilde_n[NUMNODES];
    for (int i = 0; i < NUMNODES; i++) {
        R_tilde_n[i] = T_overline.transpose() * Tn[i];
        phi_tilde_n[i] = rotutils::VecRot(R_tilde_n[i]);
        // if (phi_tilde_n[i].Length()*CH_C_RAD_TO_DEG > 15)
        //    GetLog() << "WARNING phi_tilde_n[" << i << "]=" <<  phi_tilde_n[i].Length()*CH_C_RAD_TO_DEG << "�\n";
    }
}